

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

Encoding ON_String::ProbableEncoding(char *buffer,int buffer_length)

{
  bool bVar1;
  Encoding EVar2;
  int buffer_length_00;
  size_t slen;
  ulong uVar3;
  
  EVar2 = Unknown;
  if (buffer != (char *)0x0) {
    uVar3 = (ulong)(uint)buffer_length;
    if (buffer_length == -1) {
      uVar3 = 0;
      do {
        if (buffer[uVar3] == '\0') goto LAB_005b7a57;
        uVar3 = uVar3 + 1;
      } while (uVar3 != 0x7ffffffd);
      uVar3 = 0x7ffffffd;
    }
LAB_005b7a57:
    buffer_length_00 = (int)uVar3;
    if (0 < buffer_length_00) {
      EVar2 = ASCII;
      bVar1 = IsPossibleEncoding(ASCII,buffer,buffer_length_00);
      if (!bVar1) {
        EVar2 = UTF8;
        bVar1 = IsPossibleEncoding(UTF8,buffer,buffer_length_00);
        if (!bVar1) {
          EVar2 = BIG5andASCII;
          bVar1 = IsPossibleEncoding(BIG5andASCII,buffer,buffer_length_00);
          if (!bVar1) {
            bVar1 = IsPossibleEncoding(SloppyUTF8,buffer,buffer_length_00);
            EVar2 = (uint)bVar1 + (uint)bVar1 * 2 + Unknown;
          }
        }
      }
    }
  }
  return EVar2;
}

Assistant:

ON_String::Encoding ON_String::ProbableEncoding(
  const char* buffer,
  int buffer_length
)
{
  if (nullptr == buffer)
    return ON_String::Encoding::Unknown;
  if (-1 == buffer_length)
    buffer_length = ON_String::Length(buffer);

  if (buffer_length <= 0)
    return ON_String::Encoding::Unknown;

  if (ON_String::IsPossibleEncoding(ON_String::Encoding::ASCII, buffer, buffer_length))
    return ON_String::Encoding::ASCII;
  if (ON_String::IsPossibleEncoding(ON_String::Encoding::UTF8, buffer, buffer_length))
    return ON_String::Encoding::UTF8;
  if (ON_String::IsPossibleEncoding(ON_String::Encoding::BIG5andASCII, buffer, buffer_length))
    return ON_String::Encoding::BIG5andASCII;
  if (ON_String::IsPossibleEncoding(ON_String::Encoding::SloppyUTF8, buffer, buffer_length))
    return ON_String::Encoding::SloppyUTF8;

  return ON_String::Encoding::Unknown;
}